

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateCppModuleUsings_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  _Rb_tree_header *p_Var1;
  VulkanHppGenerator *pVVar2;
  VulkanHppGenerator *pVVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  _Base_ptr p_Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char *pcVar14;
  VulkanHppGenerator *pVVar15;
  ulong uVar16;
  undefined8 uVar17;
  long lVar18;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_04;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_05;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_06;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_07;
  string strippedValue;
  string usingTemplate;
  string dynamicLoaderUsing;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string valueName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> exceptionsUsings;
  string resultExceptionsUsings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> className;
  string baseTypes;
  string smartHandleUsings;
  string enhancedModeUsings;
  array<const_char_*,_2UL> hardCodedResultValueTypes;
  array<const_char_*,_7UL> hardCodedExceptionTypesAndFunctions;
  array<const_char_*,_2UL> toString;
  array<const_char_*,_4UL> flagsBitWiseOperatorsUsings;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570;
  allocator_type local_529;
  string local_528;
  undefined1 local_508 [32];
  _Alloc_hider local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_488;
  undefined1 local_448 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  allocator_type local_3e1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  VulkanHppGenerator *local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  _Base_ptr local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  _Base_ptr local_270;
  char *local_268 [2];
  undefined8 local_258;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  char *local_248;
  char *pcStack_240;
  char *local_238;
  char *pcStack_230;
  char *local_228;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  char *local_208 [5];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  local_3a0 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_528,"  using VULKAN_HPP_NAMESPACE::${className};\n","");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "  //=====================================\n  //=== HARDCODED TYPEs AND FUNCTIONs ===\n  //=====================================\n  using VULKAN_HPP_NAMESPACE::ArrayWrapper1D;\n  using VULKAN_HPP_NAMESPACE::ArrayWrapper2D;\n  using VULKAN_HPP_NAMESPACE::Flags;\n  using VULKAN_HPP_NAMESPACE::FlagTraits;\n  namespace detail\n  {\n    using VULKAN_HPP_NAMESPACE::detail::DispatchLoaderBase;\n    using VULKAN_HPP_NAMESPACE::detail::DispatchLoaderDynamic;\n#if !defined( VK_NO_PROTOTYPES )\n    using VULKAN_HPP_NAMESPACE::detail::DispatchLoaderStatic;\n    using VULKAN_HPP_NAMESPACE::detail::getDispatchLoaderStatic;\n#endif /*VK_NO_PROTOTYPES*/\n  }\n"
             ,"");
  local_208[2] = "operator^";
  local_208[3] = "operator~";
  local_208[0] = "operator&";
  local_208[1] = "operator|";
  lVar18 = 0;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[10],_const_char_*const_&,_true>
              (&local_2d8,(char (*) [10])"className",(char **)((long)local_208 + lVar18));
    __l._M_len = 1;
    __l._M_array = &local_2d8;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_60,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_488,(allocator_type *)&local_4c8);
    replaceWithMap(&local_3e0.first,&local_528,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_60);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_3e0.first._M_dataplus._M_p,
               local_3e0.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
      operator_delete(local_3e0.first._M_dataplus._M_p,
                      local_3e0.first.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.second._M_dataplus._M_p != &local_2d8.second.field_2) {
      operator_delete(local_2d8.second._M_dataplus._M_p,
                      local_2d8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.first._M_dataplus._M_p != &local_2d8.first.field_2) {
      operator_delete(local_2d8.first._M_dataplus._M_p,
                      local_2d8.first.field_2._M_allocated_capacity + 1);
    }
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x20);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"using VULKAN_HPP_DEFAULT_DISPATCHER_TYPE;\n");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  lVar18 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,*(char **)((long)&DAT_0027b150 + lVar18),
               (allocator<char> *)&local_4c8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_2d8,(char (*) [10])"className",&local_488.first);
    __l_00._M_len = 1;
    __l_00._M_array = &local_2d8;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_90,__l_00,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_570,(allocator_type *)local_508);
    replaceWithMap(&local_3e0.first,&local_528,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_90);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_290,local_3e0.first._M_dataplus._M_p,local_3e0.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
      operator_delete(local_3e0.first._M_dataplus._M_p,
                      local_3e0.first.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.second._M_dataplus._M_p != &local_2d8.second.field_2) {
      operator_delete(local_2d8.second._M_dataplus._M_p,
                      local_2d8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.first._M_dataplus._M_p != &local_2d8.first.field_2) {
      operator_delete(local_2d8.first._M_dataplus._M_p,
                      local_2d8.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488.first._M_dataplus._M_p != &local_488.first.field_2) {
      operator_delete(local_488.first._M_dataplus._M_p,
                      local_488.first.field_2._M_allocated_capacity + 1);
    }
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x28);
  paVar13 = &local_3e0.first.field_2;
  pcVar14 = "VULKAN_HPP_DISABLE_ENHANCED_MODE";
  local_3e0.first._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e0,"VULKAN_HPP_DISABLE_ENHANCED_MODE","");
  generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2d8,(VulkanHppGenerator *)pcVar14,&local_3e0.first,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_3e0.first._M_dataplus._M_p,
                    local_3e0.first.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_570.first,"\n",&local_2d8.first);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_570.first,local_290._M_dataplus._M_p,local_290._M_string_length);
  paVar12 = &local_4c8.first.field_2;
  local_4c8.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p == paVar10) {
    local_4c8.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_4c8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_4c8.first._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_4c8.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_4c8.first._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_4c8.first,local_2d8.second._M_dataplus._M_p,
                     local_2d8.second._M_string_length);
  local_488.first._M_dataplus._M_p = (pointer)&local_488.first.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if (paVar10 == paVar11) {
    local_488.first.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_488.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_488.first.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_488.first._M_dataplus._M_p = (pointer)paVar10;
  }
  local_488.first._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_488.first,"\n");
  local_3e0.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p == paVar10) {
    local_3e0.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_3e0.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_3e0.first._M_dataplus._M_p = (pointer)paVar13;
  }
  else {
    local_3e0.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_3e0.first._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_3e0.first._M_dataplus._M_p,
             local_3e0.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_3e0.first._M_dataplus._M_p,
                    local_3e0.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.first._M_dataplus._M_p != &local_488.first.field_2) {
    operator_delete(local_488.first._M_dataplus._M_p,
                    local_488.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p != paVar12) {
    operator_delete(local_4c8.first._M_dataplus._M_p,
                    local_4c8.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != &local_570.first.field_2) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f8,"  namespace detail\n  {\n","");
  lVar18 = 0;
  do {
    local_4c8.first._M_dataplus._M_p = (pointer)&local_4c8.first.field_2;
    local_570.first._M_dataplus._M_p = (pointer)0x28;
    local_4c8.first._M_dataplus._M_p =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   (&local_4c8.first,(size_type *)&local_570,0);
    local_4c8.first.field_2._M_allocated_capacity = (size_type)local_570.first._M_dataplus._M_p;
    builtin_strncpy(local_4c8.first._M_dataplus._M_p,"    using VULKAN_HPP_NAMESPACE::detail::",0x28
                   );
    local_4c8.first._M_string_length = (size_type)local_570.first._M_dataplus._M_p;
    local_4c8.first._M_dataplus._M_p[local_570.first._M_dataplus._M_p] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_4c8.first,*(char **)((long)&DAT_0027b178 + lVar18));
    local_488.first._M_dataplus._M_p = (pointer)&local_488.first.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar8->_M_dataplus)._M_p;
    paVar12 = &pbVar8->field_2;
    if (paVar13 == paVar12) {
      local_488.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_488.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    }
    else {
      local_488.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_488.first._M_dataplus._M_p = (pointer)paVar13;
    }
    local_488.first._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_488.first,";\n");
    local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar8->_M_dataplus)._M_p;
    paVar12 = &pbVar8->field_2;
    if (paVar13 == paVar12) {
      local_3e0.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_3e0.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    }
    else {
      local_3e0.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_3e0.first._M_dataplus._M_p = (pointer)paVar13;
    }
    local_3e0.first._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_2f8,local_3e0.first._M_dataplus._M_p,local_3e0.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
      operator_delete(local_3e0.first._M_dataplus._M_p,
                      local_3e0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488.first._M_dataplus._M_p != &local_488.first.field_2) {
      operator_delete(local_488.first._M_dataplus._M_p,
                      local_488.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8.first._M_dataplus._M_p != &local_4c8.first.field_2) {
      operator_delete(local_4c8.first._M_dataplus._M_p,
                      local_4c8.first.field_2._M_allocated_capacity + 1);
    }
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_2f8,
             "    }\n\n  using VULKAN_HPP_NAMESPACE::SharedHandle;\n  using VULKAN_HPP_NAMESPACE::UniqueHandle;\n"
            );
  local_488.first._M_dataplus._M_p = (pointer)&local_488.first.field_2;
  pcVar14 = "VULKAN_HPP_NO_SMART_HANDLE";
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_488,"VULKAN_HPP_NO_SMART_HANDLE","");
  pVVar15 = local_3a0;
  paVar12 = &local_4c8.first.field_2;
  paVar13 = &local_570.first.field_2;
  generateProtection(&local_3e0,(VulkanHppGenerator *)pcVar14,&local_488.first,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.first._M_dataplus._M_p != &local_488.first.field_2) {
    operator_delete(local_488.first._M_dataplus._M_p,
                    local_488.first.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508,"\n"
                 ,&local_3e0.first);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508,
                     local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
  local_570.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p == paVar10) {
    local_570.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_570.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_570.first._M_dataplus._M_p = (pointer)paVar13;
  }
  else {
    local_570.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_570.first._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_570.first,local_3e0.second._M_dataplus._M_p,
                     local_3e0.second._M_string_length);
  local_4c8.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p == paVar10) {
    local_4c8.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_4c8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_4c8.first._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_4c8.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_4c8.first._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_4c8.first,"\n");
  local_488.first._M_dataplus._M_p = (pointer)&local_488.first.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if (paVar10 == paVar11) {
    local_488.first.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_488.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_488.first.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_488.first._M_dataplus._M_p = (pointer)paVar10;
  }
  local_488.first._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_488.first._M_dataplus._M_p,
             local_488.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.first._M_dataplus._M_p != &local_488.first.field_2) {
    operator_delete(local_488.first._M_dataplus._M_p,
                    local_488.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p != paVar12) {
    operator_delete(local_4c8.first._M_dataplus._M_p,
                    local_4c8.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
    operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_508,"exchange",(allocator<char> *)&local_258);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_488,(char (*) [10])"className",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508);
  __l_01._M_len = 1;
  __l_01._M_array = &local_488;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_1b0,__l_01,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_318,(allocator_type *)&local_408);
  replaceWithMap(&local_570.first,&local_528,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1b0);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_570.first,0,0,"\n",1);
  local_4c8.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p == paVar10) {
    local_4c8.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_4c8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_4c8.first._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_4c8.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_4c8.first._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_4c8.first._M_dataplus._M_p,
             local_4c8.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p != paVar12) {
    operator_delete(local_4c8.first._M_dataplus._M_p,
                    local_4c8.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.second._M_dataplus._M_p != &local_488.second.field_2) {
    operator_delete(local_488.second._M_dataplus._M_p,
                    local_488.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.first._M_dataplus._M_p != &local_488.first.field_2) {
    operator_delete(local_488.first._M_dataplus._M_p,
                    local_488.first.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
    operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
  }
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,
             "\n  //==================\n  //=== BASE TYPEs ===\n  //==================\n","");
  p_Var9 = (pVVar15->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(pVVar15->m_baseTypes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var9 + 1),"VkFlags");
      if (((iVar7 != 0) &&
          (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var9 + 1),"VkFlags64"), iVar7 != 0)) &&
         (p_Var9[3]._M_parent != (_Base_ptr)0x0)) {
        local_508._0_8_ = local_508 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"Vk","");
        local_570.first._M_dataplus._M_p = (pointer)&local_570.first.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_570,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        uVar17 = local_508._8_8_;
        if (((ulong)local_508._8_8_ <= local_570.first._M_string_length) &&
           ((local_508._8_8_ == 0 ||
            (iVar7 = bcmp(local_570.first._M_dataplus._M_p,(void *)local_508._0_8_,local_508._8_8_),
            iVar7 == 0)))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    (&local_570.first,0,uVar17);
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_488,(char (*) [10])"className",&local_570.first);
        __l_02._M_len = 1;
        __l_02._M_array = &local_488;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_c0,__l_02,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_258,(allocator_type *)&local_408);
        replaceWithMap(&local_4c8.first,&local_528,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_c0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_318,local_4c8.first._M_dataplus._M_p,local_4c8.first._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8.first._M_dataplus._M_p != &local_4c8.first.field_2) {
          operator_delete(local_4c8.first._M_dataplus._M_p,
                          local_4c8.first.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488.second._M_dataplus._M_p != &local_488.second.field_2) {
          operator_delete(local_488.second._M_dataplus._M_p,
                          local_488.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488.first._M_dataplus._M_p != &local_488.first.field_2) {
          operator_delete(local_488.first._M_dataplus._M_p,
                          local_488.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570.first._M_dataplus._M_p != &local_570.first.field_2) {
          operator_delete(local_570.first._M_dataplus._M_p,
                          local_570.first.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
          operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_318._M_dataplus._M_p,local_318._M_string_length);
  generateCppModuleEnumUsings_abi_cxx11_(&local_488.first,local_3a0);
  paVar13 = &local_4c8.first.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_488.first._M_dataplus._M_p,
             local_488.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.first._M_dataplus._M_p != &local_488.first.field_2) {
    operator_delete(local_488.first._M_dataplus._M_p,
                    local_488.first.field_2._M_allocated_capacity + 1);
  }
  local_218 = 0x2290a8;
  uStack_214 = 0;
  uStack_210 = 0x2290b2;
  uStack_20c = 0;
  pcVar14 = "VULKAN_HPP_NO_TO_STRING";
  local_4c8.first._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"VULKAN_HPP_NO_TO_STRING","")
  ;
  generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_488,(VulkanHppGenerator *)pcVar14,&local_4c8.first,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_4c8.first._M_dataplus._M_p,
                    local_4c8.first.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_4c8.first,
                 "\n  //======================\n  //=== ENUM to_string ===\n  //======================\n"
                 ,&local_488.first);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_4c8.first._M_dataplus._M_p,
             local_4c8.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_4c8.first._M_dataplus._M_p,
                    local_4c8.first.field_2._M_allocated_capacity + 1);
  }
  lVar18 = 0;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[10],_const_char_*const_&,_true>
              (&local_4c8,(char (*) [10])"className",(char **)((long)&local_218 + lVar18));
    __l_03._M_len = 1;
    __l_03._M_array = &local_4c8;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_f0,__l_03,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          local_508,(allocator_type *)&local_258);
    replaceWithMap(&local_570.first,&local_528,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_f0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_570.first._M_dataplus._M_p,
               local_570.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570.first._M_dataplus._M_p != &local_570.first.field_2) {
      operator_delete(local_570.first._M_dataplus._M_p,
                      local_570.first.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8.second._M_dataplus._M_p != &local_4c8.second.field_2) {
      operator_delete(local_4c8.second._M_dataplus._M_p,
                      local_4c8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8.first._M_dataplus._M_p != &local_4c8.first.field_2) {
      operator_delete(local_4c8.first._M_dataplus._M_p,
                      local_4c8.first.field_2._M_allocated_capacity + 1);
    }
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x10);
  paVar12 = &local_4c8.first.field_2;
  local_4c8.first._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c8,local_488.second._M_dataplus._M_p,
             local_488.second._M_dataplus._M_p + local_488.second._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_4c8.first,"\n");
  paVar13 = &local_570.first.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_4c8.first._M_dataplus._M_p,
             local_4c8.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p != paVar12) {
    operator_delete(local_4c8.first._M_dataplus._M_p,
                    local_4c8.first.field_2._M_allocated_capacity + 1);
  }
  local_228 = "make_error_condition";
  local_238 = "errorCategory";
  pcStack_230 = "make_error_code";
  local_248 = "LogicError";
  pcStack_240 = "SystemError";
  local_258._0_4_ = 0x229129;
  local_258._4_4_ = 0;
  uStack_250 = 0x229140;
  uStack_24c = 0;
  pcVar14 = "VULKAN_HPP_NO_EXCEPTIONS";
  local_570.first._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_570,"VULKAN_HPP_NO_EXCEPTIONS","");
  generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4c8,(VulkanHppGenerator *)pcVar14,&local_570.first,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  local_570.first._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_570,
             "\n  //=============================\n  //=== EXCEPTIONs AND ERRORs ===\n  //=============================\n"
             ,"");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_570.first,local_4c8.first._M_dataplus._M_p,
                     local_4c8.first._M_string_length);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar12 == paVar10) {
    local_408.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_408.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_408.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_408._M_dataplus._M_p = (pointer)paVar12;
  }
  local_408._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  lVar18 = 0;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[10],_const_char_*const_&,_true>
              (&local_570,(char (*) [10])"className",(char **)((long)&local_258 + lVar18));
    __l_04._M_len = 1;
    __l_04._M_array = &local_570;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_120,__l_04,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_398,(allocator_type *)local_448);
    replaceWithMap((string *)local_508,&local_528,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_120);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_408,(char *)local_508._0_8_,local_508._8_8_);
    if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
      operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570.second._M_dataplus._M_p != &local_570.second.field_2) {
      operator_delete(local_570.second._M_dataplus._M_p,
                      local_570.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570.first._M_dataplus._M_p != &local_570.first.field_2) {
      operator_delete(local_570.first._M_dataplus._M_p,
                      local_570.first.field_2._M_allocated_capacity + 1);
    }
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_408._M_dataplus._M_p,local_408._M_string_length);
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  local_398._M_string_length = 0;
  local_398.field_2._M_local_buf[0] = '\0';
  paVar13 = &local_570.first.field_2;
  local_570.first._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"VkResult","");
  local_298 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
              ::find(&(local_3a0->m_enums)._M_t,&local_570.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  p_Var4 = local_298 + 5;
  local_270 = local_298[5]._M_right;
  if (p_Var4->_M_left != local_270) {
    local_298 = local_298 + 1;
    pVVar15 = (VulkanHppGenerator *)(local_358 + 0x10);
    p_Var9 = p_Var4->_M_left + 2;
    do {
      if ((char)p_Var9[2]._M_color == _S_black) {
        local_570.first._M_string_length = *(size_type *)&p_Var9->_M_color;
        local_570.first._M_dataplus._M_p = (pointer)p_Var9->_M_parent;
        bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_570,"VK_ERROR"
                          );
        if (bVar6) {
          generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_570,pVVar15,(string *)(p_Var9 + 1),true);
          if (local_570.first._M_string_length == 0) {
            local_508._0_8_ = local_508 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_508,local_570.first._M_dataplus._M_p);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_508,"\n",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_570);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_570
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508
                    );
          if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
            operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
          }
          local_508._0_8_ = local_508 + 0x10;
          if (local_570.second._M_string_length == 0) {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_508,local_570.second._M_dataplus._M_p);
          }
          else {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_508,local_570.second._M_dataplus._M_p,
                       local_570.second._M_dataplus._M_p + local_570.second._M_string_length);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_508,"\n");
          }
          generateCppModuleUsings_abi_cxx11_();
          generateEnumValueName
                    ((string *)local_448,local_3a0,(string *)local_298,(string *)p_Var9,false);
          local_428._M_allocated_capacity = (size_type)&local_418;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"eError","");
          local_508._0_8_ = local_508 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_508,local_448._0_8_,
                     (pointer)(local_448._0_8_ + local_448._8_8_));
          uVar17 = local_428._8_8_;
          if (((ulong)local_428._8_8_ <= (ulong)local_508._8_8_) &&
             ((local_428._8_8_ == 0 ||
              (iVar7 = bcmp((void *)local_508._0_8_,(void *)local_428._M_allocated_capacity,
                            local_428._8_8_), iVar7 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_508,0,uVar17);
          }
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_508,"Error");
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar8->_M_dataplus)._M_p;
          paVar12 = &pbVar8->field_2;
          if (paVar13 == paVar12) {
            local_378.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_378.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          }
          else {
            local_378.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_378._M_dataplus._M_p = (pointer)paVar13;
          }
          local_378._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
            operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_allocated_capacity != &local_418) {
            operator_delete((void *)local_428._M_allocated_capacity,
                            local_418._M_allocated_capacity + 1);
          }
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_508,(char (*) [10])"className",&local_378);
          __l_05._M_len = 1;
          __l_05._M_array =
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_508;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_180,__l_05,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_268,&local_529);
          replaceWithMap((string *)&local_338,&local_528,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_180);
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_338,0,0,local_570.first._M_dataplus._M_p,
                           local_570.first._M_string_length);
          local_358._0_8_ = (pbVar8->_M_dataplus)._M_p;
          paVar13 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._0_8_ == paVar13) {
            local_358._16_8_ = paVar13->_M_allocated_capacity;
            local_358._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_358._0_8_ = pVVar15;
          }
          else {
            local_358._16_8_ = paVar13->_M_allocated_capacity;
          }
          local_358._8_8_ = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_358,local_570.second._M_dataplus._M_p,
                             local_570.second._M_string_length);
          local_428._M_allocated_capacity = (size_type)(pbVar8->_M_dataplus)._M_p;
          paVar13 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_allocated_capacity == paVar13) {
            local_418._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_418._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_428._M_allocated_capacity = (size_type)&local_418;
          }
          else {
            local_418._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_428._8_8_ = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_398,(char *)local_428._M_allocated_capacity,local_428._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_allocated_capacity != &local_418) {
            operator_delete((void *)local_428._M_allocated_capacity,
                            local_418._M_allocated_capacity + 1);
          }
          if ((VulkanHppGenerator *)local_358._0_8_ != pVVar15) {
            operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_allocated_capacity != &local_328) {
            operator_delete((void *)local_338._M_allocated_capacity,
                            local_328._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_180);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_p != &local_4d8) {
            operator_delete(local_4e8._M_p,local_4d8._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
            operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          if ((VulkanHppGenerator *)local_448._0_8_ != (VulkanHppGenerator *)(local_448 + 0x10)) {
            operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570.second._M_dataplus._M_p != &local_570.second.field_2) {
            operator_delete(local_570.second._M_dataplus._M_p,
                            local_570.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570.first._M_dataplus._M_p != &local_570.first.field_2) {
            operator_delete(local_570.first._M_dataplus._M_p,
                            local_570.first.field_2._M_allocated_capacity + 1);
          }
        }
      }
      p_Var5 = p_Var9 + 3;
      p_Var9 = (_Base_ptr)&p_Var9[5]._M_left;
    } while ((_Base_ptr)&p_Var5->_M_left != local_270);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_398._M_dataplus._M_p,local_398._M_string_length);
  paVar13 = &local_570.first.field_2;
  local_570.first._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_570,local_4c8.second._M_dataplus._M_p,
             local_4c8.second._M_dataplus._M_p + local_4c8.second._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_570.first,"\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_570.first._M_dataplus._M_p,
             local_570.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  local_268[0] = "ResultValue";
  local_268[1] = "ResultValueType";
  lVar18 = 0;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[10],_const_char_*const_&,_true>
              (&local_570,(char (*) [10])"className",(char **)((long)local_268 + lVar18));
    __l_06._M_len = 1;
    __l_06._M_array = &local_570;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_150,__l_06,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          local_448,(allocator_type *)&local_378);
    replaceWithMap((string *)local_508,&local_528,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_150);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,(char *)local_508._0_8_,local_508._8_8_);
    if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
      operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570.second._M_dataplus._M_p != &local_570.second.field_2) {
      operator_delete(local_570.second._M_dataplus._M_p,
                      local_570.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570.first._M_dataplus._M_p != &local_570.first.field_2) {
      operator_delete(local_570.first._M_dataplus._M_p,
                      local_570.first.field_2._M_allocated_capacity + 1);
    }
    pVVar15 = local_3a0;
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x10);
  generateConstexprUsings_abi_cxx11_((string *)local_448,local_3a0);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448
                      ,0,0,"\n",1);
  paVar13 = &local_570.first.field_2;
  pVVar2 = (VulkanHppGenerator *)(local_508 + 0x10);
  local_508._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._0_8_ == paVar12) {
    local_508._16_8_ = paVar12->_M_allocated_capacity;
    local_508._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_508._0_8_ = pVVar2;
  }
  else {
    local_508._16_8_ = paVar12->_M_allocated_capacity;
  }
  local_508._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508
                      ,"\n");
  local_570.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p == paVar12) {
    local_570.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_570.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_570.first._M_dataplus._M_p = (pointer)paVar13;
  }
  else {
    local_570.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_570.first._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_570.first._M_dataplus._M_p,
             local_570.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  if ((VulkanHppGenerator *)local_508._0_8_ != pVVar2) {
    operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
  }
  pVVar3 = (VulkanHppGenerator *)(local_448 + 0x10);
  if ((VulkanHppGenerator *)local_448._0_8_ != pVVar3) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
  }
  generateCppModuleFuncpointerUsings_abi_cxx11_(&local_570.first,pVVar15);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_570.first._M_dataplus._M_p,
             local_570.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  generateCppModuleStructUsings_abi_cxx11_(&local_570.first,pVVar15);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_570.first._M_dataplus._M_p,
             local_570.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  generateCppModuleHandleUsings_abi_cxx11_(&local_570.first,pVVar15);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_570.first._M_dataplus._M_p,
             local_570.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  generateCppModuleUniqueHandleUsings_abi_cxx11_(&local_570.first,pVVar15);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_570.first._M_dataplus._M_p,
             local_570.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  generateCppModuleSharedHandleUsings_abi_cxx11_(&local_570.first,pVVar15);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_570.first._M_dataplus._M_p,
             local_570.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  generateCppModuleFuncsUsings_abi_cxx11_(&local_570.first,pVVar15);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_570.first._M_dataplus._M_p,
             local_570.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  pcVar14 = "VULKAN_HPP_DISABLE_ENHANCED_MODE";
  local_508._0_8_ = pVVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_508,"VULKAN_HPP_DISABLE_ENHANCED_MODE","");
  generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_570,(VulkanHppGenerator *)pcVar14,(string *)local_508,false);
  if ((VulkanHppGenerator *)local_508._0_8_ != pVVar2) {
    operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,"\n"
                 ,&local_570.first);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[10],_const_char_(&)[14],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_508,(char (*) [10])"className",(char (*) [14])"StructExtends");
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)local_508;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_1e0,__l_07,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_529,&local_3e1);
  replaceWithMap((string *)&local_338,&local_528,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1e0);
  uVar16 = 0xf;
  if ((VulkanHppGenerator *)local_358._0_8_ != (VulkanHppGenerator *)(local_358 + 0x10)) {
    uVar16 = local_358._16_8_;
  }
  if (uVar16 < (ulong)(local_358._8_8_ + local_338._8_8_)) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      uVar17 = local_328._M_allocated_capacity;
    }
    if ((ulong)(local_358._8_8_ + local_338._8_8_) <= (ulong)uVar17) {
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_338,0,0,(char *)local_358._0_8_,local_358._8_8_);
      goto LAB_0012aa4d;
    }
  }
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     (char *)local_338._M_allocated_capacity,local_338._8_8_);
LAB_0012aa4d:
  local_428._M_allocated_capacity = (size_type)&local_418;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if (paVar10 == paVar12) {
    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_418._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_418._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_428._M_allocated_capacity = (size_type)paVar10;
  }
  local_428._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  paVar12->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428
                     ,local_570.second._M_dataplus._M_p,local_570.second._M_string_length);
  local_378._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p == paVar12) {
    local_378.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_378.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  }
  else {
    local_378.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_378._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_378,"\n");
  local_448._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._0_8_ == paVar12) {
    local_448._16_8_ = paVar12->_M_allocated_capacity;
    local_448._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_448._0_8_ = pVVar3;
  }
  else {
    local_448._16_8_ = paVar12->_M_allocated_capacity;
  }
  local_448._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(char *)local_448._0_8_,local_448._8_8_);
  if ((VulkanHppGenerator *)local_448._0_8_ != pVVar3) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_allocated_capacity != &local_418) {
    operator_delete((void *)local_428._M_allocated_capacity,local_418._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_allocated_capacity != &local_328) {
    operator_delete((void *)local_338._M_allocated_capacity,local_328._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_p != &local_4d8) {
    operator_delete(local_4e8._M_p,local_4d8._M_allocated_capacity + 1);
  }
  if ((VulkanHppGenerator *)local_508._0_8_ != pVVar2) {
    operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
  }
  if ((VulkanHppGenerator *)local_358._0_8_ != (VulkanHppGenerator *)(local_358 + 0x10)) {
    operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
  }
  local_508._0_8_ = pVVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_508,
             "#if VULKAN_HPP_ENABLE_DYNAMIC_LOADER_TOOL\n  namespace detail\n  {\n    using VULKAN_HPP_NAMESPACE::detail::DynamicLoader;\n  }\n#endif /*VULKAN_HPP_ENABLE_DYNAMIC_LOADER_TOOL*/\n"
             ,"");
  pVVar15 = (VulkanHppGenerator *)local_508._0_8_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(char *)local_508._0_8_,local_508._8_8_);
  generateCppModuleFormatTraitsUsings_abi_cxx11_((string *)local_448,pVVar15);
  pVVar15 = (VulkanHppGenerator *)local_448._0_8_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(char *)local_448._0_8_,local_448._8_8_);
  if ((VulkanHppGenerator *)local_448._0_8_ != pVVar3) {
    pVVar15 = (VulkanHppGenerator *)(local_448._16_8_ + 1);
    operator_delete((void *)local_448._0_8_,(ulong)pVVar15);
  }
  generateCppModuleExtensionInspectionUsings_abi_cxx11_((string *)local_448,pVVar15);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(char *)local_448._0_8_,local_448._8_8_);
  if ((VulkanHppGenerator *)local_448._0_8_ != pVVar3) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
  }
  if ((VulkanHppGenerator *)local_508._0_8_ != pVVar2) {
    operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.second._M_dataplus._M_p != &local_570.second.field_2) {
    operator_delete(local_570.second._M_dataplus._M_p,
                    local_570.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_570.first._M_dataplus._M_p,
                    local_570.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,
                    CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                             local_398.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.second._M_dataplus._M_p != &local_4c8.second.field_2) {
    operator_delete(local_4c8.second._M_dataplus._M_p,
                    local_4c8.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.first._M_dataplus._M_p != &local_4c8.first.field_2) {
    operator_delete(local_4c8.first._M_dataplus._M_p,
                    local_4c8.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.second._M_dataplus._M_p != &local_488.second.field_2) {
    operator_delete(local_488.second._M_dataplus._M_p,
                    local_488.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.first._M_dataplus._M_p != &local_488.first.field_2) {
    operator_delete(local_488.first._M_dataplus._M_p,
                    local_488.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.second._M_dataplus._M_p != &local_3e0.second.field_2) {
    operator_delete(local_3e0.second._M_dataplus._M_p,
                    local_3e0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
    operator_delete(local_3e0.first._M_dataplus._M_p,
                    local_3e0.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.second._M_dataplus._M_p != &local_2d8.second.field_2) {
    operator_delete(local_2d8.second._M_dataplus._M_p,
                    local_2d8.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.first._M_dataplus._M_p != &local_2d8.first.field_2) {
    operator_delete(local_2d8.first._M_dataplus._M_p,
                    local_2d8.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                             local_290.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCppModuleUsings() const
{
  auto const usingTemplate = std::string{ R"(  using VULKAN_HPP_NAMESPACE::${className};
)" };

  auto const hardCodedEnhancedModeTypes      = std::array{ "ArrayProxy", "ArrayProxyNoTemporaries", "StridedArrayProxy", "Optional", "StructureChain" };
  auto const hardCodedSmartHandleHelperTypes = std::array{ "ObjectDestroy",       "ObjectFree",       "ObjectRelease",       "PoolFree",
                                                           "ObjectDestroyShared", "ObjectFreeShared", "ObjectReleaseShared", "PoolFreeShared" };
  auto const hardCodedFunctions              = std::array{ "exchange" };

  auto usings = std::string{ R"(  //=====================================
  //=== HARDCODED TYPEs AND FUNCTIONs ===
  //=====================================
  using VULKAN_HPP_NAMESPACE::ArrayWrapper1D;
  using VULKAN_HPP_NAMESPACE::ArrayWrapper2D;
  using VULKAN_HPP_NAMESPACE::Flags;
  using VULKAN_HPP_NAMESPACE::FlagTraits;
  namespace detail
  {
    using VULKAN_HPP_NAMESPACE::detail::DispatchLoaderBase;
    using VULKAN_HPP_NAMESPACE::detail::DispatchLoaderDynamic;
#if !defined( VK_NO_PROTOTYPES )
    using VULKAN_HPP_NAMESPACE::detail::DispatchLoaderStatic;
    using VULKAN_HPP_NAMESPACE::detail::getDispatchLoaderStatic;
#endif /*VK_NO_PROTOTYPES*/
  }
)" };

  // insert the Flags bitwise operators
  auto const flagsBitWiseOperatorsUsings = std::array{ "operator&", "operator|", "operator^", "operator~" };
  for ( auto const & operatorName : flagsBitWiseOperatorsUsings )
  {
    usings += replaceWithMap( usingTemplate, { { "className", operatorName } } );
  }

  // delete the namespace declaration for the default dispatcher macro using statement
  usings += R"(using VULKAN_HPP_DEFAULT_DISPATCHER_TYPE;
)";

  auto enhancedModeUsings = std::string{};
  for ( auto const & className : hardCodedEnhancedModeTypes )
  {
    enhancedModeUsings += replaceWithMap( usingTemplate, { { "className", std::string{ className } } } );
  }
  // protect the enhanced-mode usings with a macro
  const auto [enterEnhancedMode, leaveEnhancedMode] = generateProtection( "VULKAN_HPP_DISABLE_ENHANCED_MODE", false );
  usings += "\n" + enterEnhancedMode + enhancedModeUsings + leaveEnhancedMode + "\n";

  std::string smartHandleUsings = "  namespace detail\n  {\n";
  for ( auto const & helperType : hardCodedSmartHandleHelperTypes )
  {
    smartHandleUsings += "    using VULKAN_HPP_NAMESPACE::detail::"s + helperType + ";\n";
  }
  smartHandleUsings += R"(    }

  using VULKAN_HPP_NAMESPACE::SharedHandle;
  using VULKAN_HPP_NAMESPACE::UniqueHandle;
)";

  // likewise for the smart-handle usings
  const auto [enterNoSmartHandle, leaveNoSmartHandle] = generateProtection( "VULKAN_HPP_NO_SMART_HANDLE", false );
  usings += "\n" + enterNoSmartHandle + smartHandleUsings + leaveNoSmartHandle + "\n";

  for ( auto const & functionName : hardCodedFunctions )
  {
    usings += "\n" + replaceWithMap( usingTemplate, { { "className", std::string{ functionName } } } );
  }

  // now generate baseTypes
  auto baseTypes = std::string{ R"(
  //==================
  //=== BASE TYPEs ===
  //==================
)" };
  for ( auto const & baseType : m_baseTypes )
  {
    if ( baseType.first != "VkFlags" && baseType.first != "VkFlags64" && !baseType.second.typeInfo.type.empty() )
    {
      baseTypes += replaceWithMap( usingTemplate, { { "className", stripPrefix( baseType.first, "Vk" ) } } );
    }
  }
  usings += baseTypes;

  // generate Enums
  usings += generateCppModuleEnumUsings();

  // to_string, toHexString
  auto const toString                       = std::array{ "to_string", "toHexString" };
  auto const [toStringEnter, toStringLeave] = generateProtection( "VULKAN_HPP_NO_TO_STRING", false );

  usings += R"(
  //======================
  //=== ENUM to_string ===
  //======================
)" + toStringEnter;
  for ( auto const & name : toString )
  {
    usings += replaceWithMap( usingTemplate, { { "className", name } } );
  }
  usings += toStringLeave + "\n";

  // hardcoded exceptions and functions
  auto const hardCodedExceptionTypesAndFunctions =
    std::array{ "ErrorCategoryImpl", "Error", "LogicError", "SystemError", "errorCategory", "make_error_code", "make_error_condition" };
  const auto [exceptionsEnter, exceptionsLeave] = generateProtection( "VULKAN_HPP_NO_EXCEPTIONS", false );

  auto exceptionsUsings = std::string{ R"(
  //=============================
  //=== EXCEPTIONs AND ERRORs ===
  //=============================
)" } + exceptionsEnter;

  for ( auto const & name : hardCodedExceptionTypesAndFunctions )
  {
    exceptionsUsings += replaceWithMap( usingTemplate, { { "className", name } } );
  }

  usings += exceptionsUsings;

  // result Exceptions
  auto resultExceptionsUsings = std::string{};
  auto const & [name, data]   = *m_enums.find( "VkResult" );
  for ( auto const & value : data.values )
  {
    if ( value.supported && value.name.starts_with( "VK_ERROR" ) )
    {
      auto [enter, leave] = generateProtection( value.protect );
      enter               = enter.empty() ? enter : "\n" + enter;
      leave               = leave.empty() ? leave : leave + "\n";

      auto const valueName = generateEnumValueName( name, value.name, false );
      auto const className = stripPrefix( valueName, "eError" ) + "Error";

      resultExceptionsUsings += enter + replaceWithMap( usingTemplate, { { "className", className } } ) + leave;
    }
  }
  usings += resultExceptionsUsings;

  usings += exceptionsLeave + "\n";

  // some hardcoded types
  auto const hardCodedResultValueTypes = std::array{ "ResultValue", "ResultValueType" };
  for ( auto const & valueType : hardCodedResultValueTypes )
  {
    usings += replaceWithMap( usingTemplate, { { "className", valueType } } );
  }

  usings += "\n" + generateConstexprUsings() + "\n";

  // structs, handles, UniqueHandles, etc
  usings += generateCppModuleFuncpointerUsings();
  usings += generateCppModuleStructUsings();
  usings += generateCppModuleHandleUsings();
  usings += generateCppModuleUniqueHandleUsings();
  usings += generateCppModuleSharedHandleUsings();
  usings += generateCppModuleFuncsUsings();

  auto const [enterDisableEnhanced, leaveDisableEnhanced] = generateProtection( "VULKAN_HPP_DISABLE_ENHANCED_MODE", false );
  usings += "\n" + enterDisableEnhanced + replaceWithMap( usingTemplate, { { "className", "StructExtends" } } ) + leaveDisableEnhanced + "\n";

  auto const dynamicLoaderUsing = std::string{ R"(#if VULKAN_HPP_ENABLE_DYNAMIC_LOADER_TOOL
  namespace detail
  {
    using VULKAN_HPP_NAMESPACE::detail::DynamicLoader;
  }
#endif /*VULKAN_HPP_ENABLE_DYNAMIC_LOADER_TOOL*/
)" };
  usings += dynamicLoaderUsing;

  usings += generateCppModuleFormatTraitsUsings();
  usings += generateCppModuleExtensionInspectionUsings();

  return usings;
}